

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.hh
# Opt level: O1

void __thiscall OB::Parg::Parg(Parg *this,int _argc,char **_argv)

{
  _Rb_tree_header *p_Var1;
  
  this->argc_ = _argc;
  (this->argv_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->argv_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->argv_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  (this->version_)._M_dataplus._M_p = (pointer)&(this->version_).field_2;
  (this->version_)._M_string_length = 0;
  (this->version_).field_2._M_local_buf[0] = '\0';
  (this->usage_)._M_dataplus._M_p = (pointer)&(this->usage_).field_2;
  (this->usage_)._M_string_length = 0;
  (this->usage_).field_2._M_local_buf[0] = '\0';
  (this->description_)._M_dataplus._M_p = (pointer)&(this->description_).field_2;
  (this->description_)._M_string_length = 0;
  (this->description_).field_2._M_local_buf[0] = '\0';
  (this->modes_)._M_dataplus._M_p = (pointer)&(this->modes_).field_2;
  (this->modes_)._M_string_length = 0;
  (this->modes_).field_2._M_local_buf[0] = '\0';
  (this->options_)._M_dataplus._M_p = (pointer)&(this->options_).field_2;
  (this->options_)._M_string_length = 0;
  (this->options_).field_2._M_local_buf[0] = '\0';
  (this->info_).super__Vector_base<OB::Parg::info_pair,_std::allocator<OB::Parg::info_pair>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->info_).super__Vector_base<OB::Parg::info_pair,_std::allocator<OB::Parg::info_pair>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->info_).super__Vector_base<OB::Parg::info_pair,_std::allocator<OB::Parg::info_pair>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->author_)._M_dataplus._M_p = (pointer)&(this->author_).field_2;
  (this->author_)._M_string_length = 0;
  (this->author_).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->data_)._M_t._M_impl.super__Rb_tree_header;
  (this->data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->data_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->flags_)._M_t._M_impl.super__Rb_tree_header;
  (this->flags_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->flags_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->flags_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->flags_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->flags_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->is_positional_ = false;
  (this->positional_)._M_dataplus._M_p = (pointer)&(this->positional_).field_2;
  (this->positional_)._M_string_length = 0;
  (this->positional_).field_2._M_local_buf[0] = '\0';
  (this->stdin_)._M_dataplus._M_p = (pointer)&(this->stdin_).field_2;
  (this->stdin_)._M_string_length = 0;
  (this->stdin_).field_2._M_local_buf[0] = '\0';
  this->status_ = 0;
  (this->error_)._M_dataplus._M_p = (pointer)&(this->error_).field_2;
  (this->error_)._M_string_length = 0;
  (this->error_).field_2._M_local_buf[0] = '\0';
  argvf(this,_argv);
  return;
}

Assistant:

Parg(int _argc, char** _argv):
    argc_ {_argc}
  {
    argvf(_argv);
  }